

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

string * cmdline::detail::readable_typename<unsigned_int>(void)

{
  string *in_RDI;
  allocator<char> *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  std::type_info::name((type_info *)&unsigned_int::typeinfo);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  demangle(in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  return in_RDI;
}

Assistant:

std::string readable_typename() {
    return demangle(typeid(T).name());
}